

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O2

void __thiscall binlog::EventStream::readEventSource(EventStream *this,Range range)

{
  EventSource eventSource;
  Range local_d0;
  EventSource local_c0;
  
  local_d0._end = range._end;
  local_d0._begin = range._begin;
  local_c0.category._M_dataplus._M_p = (pointer)&local_c0.category.field_2;
  local_c0.id = 0;
  local_c0.severity = info;
  local_c0.category._M_string_length = 0;
  local_c0.category.field_2._M_local_buf[0] = '\0';
  local_c0.function._M_dataplus._M_p = (pointer)&local_c0.function.field_2;
  local_c0.function._M_string_length = 0;
  local_c0.function.field_2._M_local_buf[0] = '\0';
  local_c0.file._M_dataplus._M_p = (pointer)&local_c0.file.field_2;
  local_c0.file._M_string_length = 0;
  local_c0.file.field_2._M_local_buf[0] = '\0';
  local_c0.line = 0;
  local_c0.formatString._M_dataplus._M_p = (pointer)&local_c0.formatString.field_2;
  local_c0.formatString._M_string_length = 0;
  local_c0.formatString.field_2._M_local_buf[0] = '\0';
  local_c0.argumentTags._M_dataplus._M_p = (pointer)&local_c0.argumentTags.field_2;
  local_c0.argumentTags._M_string_length = 0;
  local_c0.argumentTags.field_2._M_local_buf[0] = '\0';
  mserialize::
  StructDeserializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
  ::deserialize<binlog::Range>(&local_c0,&local_d0);
  detail::SegmentedMap<binlog::EventSource>::emplace<binlog::EventSource>
            (&this->_eventSources,local_c0.id,&local_c0);
  EventSource::~EventSource(&local_c0);
  return;
}

Assistant:

void EventStream::readEventSource(Range range)
{
  EventSource eventSource;
  mserialize::deserialize(eventSource, range);
  _eventSources.emplace(eventSource.id, std::move(eventSource));
}